

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

int google::OpenObjectFileContainingPcAndGetStartAddress
              (uint64_t pc,uint64_t *start_address,uint64_t *base_address,char *out_file_name,
              int out_file_name_size)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  Elf64_Off EVar13;
  FileDescriptor wrapped_mem_fd;
  FileDescriptor wrapped_maps_fd;
  off_t local_530;
  char *local_520;
  uint64_t end_address;
  LineReader local_4e8;
  uint64_t file_offset;
  long local_4a8;
  long local_4a0;
  Elf64_Ehdr ehdr;
  char buf [1024];
  
  do {
    iVar3 = open("/proc/self/maps",0);
    wrapped_maps_fd.fd_ = iVar3;
    if (-1 < iVar3) goto LAB_0011700b;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  iVar3 = -1;
  goto LAB_0011703a;
  while (piVar7 = __errno_location(), *piVar7 == 4) {
LAB_0011700b:
    iVar4 = open("/proc/self/mem",0);
    wrapped_mem_fd.fd_ = iVar4;
    if (-1 < iVar4) {
      local_520 = buf;
      local_4e8.buf_len_ = 0x400;
      local_4e8.offset_ = 0;
      local_530 = 0;
      pcVar8 = local_520;
      local_4e8.fd_ = iVar3;
      local_4e8.buf_ = local_520;
      local_4e8.eol_ = local_520;
      local_4e8.eod_ = local_520;
      goto LAB_001170a5;
    }
  }
LAB_0011702d:
  iVar3 = -1;
  goto LAB_00117030;
LAB_001170a5:
  do {
    if (buf == local_520) {
      lVar11 = ReadFromOffset(iVar3,buf,0x400,local_530);
      if (lVar11 < 1) goto LAB_0011702d;
      local_520 = buf + lVar11;
LAB_00117176:
      local_4e8.offset_ = local_530 + lVar11;
      pcVar10 = buf;
      local_530 = local_4e8.offset_;
      local_4e8.bol_ = pcVar10;
      local_4e8.eod_ = local_520;
    }
    else {
      pcVar10 = pcVar8 + 1;
      local_4e8.bol_ = pcVar10;
      if (local_520 < pcVar10) {
        abort();
      }
      pcVar8 = anon_unknown_3::LineReader::FindLineFeed(&local_4e8);
      if (pcVar8 == (char *)0x0) {
        iVar5 = (int)local_520 - (int)pcVar10;
        memmove(buf,pcVar10,(long)iVar5);
        lVar11 = ReadFromOffset(iVar3,buf + iVar5,(long)(0x400 - iVar5),local_530);
        if (0 < lVar11) {
          local_520 = buf + iVar5 + lVar11;
          goto LAB_00117176;
        }
        goto LAB_0011702d;
      }
    }
    pcVar8 = anon_unknown_3::LineReader::FindLineFeed(&local_4e8);
    local_4e8.eol_ = pcVar8;
    if (pcVar8 == (char *)0x0) goto LAB_0011702d;
    *pcVar8 = '\0';
    pcVar10 = GetHex(pcVar10,pcVar8,start_address);
    if ((((pcVar10 == pcVar8) || (*pcVar10 != '-')) ||
        (pcVar10 = GetHex(pcVar10 + 1,pcVar8,&end_address), pcVar10 == pcVar8)) || (*pcVar10 != ' ')
       ) goto LAB_0011702d;
    lVar11 = 0;
    pcVar1 = pcVar10 + 1;
    for (pcVar9 = pcVar1; (pcVar9 < pcVar8 && (*pcVar9 != ' ')); pcVar9 = pcVar9 + 1) {
      lVar11 = lVar11 + -1;
    }
    if ((1U - lVar11 < 5) || (pcVar9 == pcVar8)) goto LAB_0011702d;
    if ((*pcVar1 == 'r') &&
       (bVar2 = ReadFromOffsetExact(iVar4,&ehdr,0x40,*start_address),
       bVar2 && ehdr.e_ident._0_4_ == 0x464c457f)) {
      if (ehdr.e_type == 2) {
        *base_address = 0;
      }
      else if (ehdr.e_type == 3) {
        *base_address = *start_address;
        uVar12 = (ulong)ehdr.e_phnum;
        EVar13 = ehdr.e_phoff;
        while (bVar2 = uVar12 != 0, uVar12 = uVar12 - 1, bVar2) {
          bVar2 = ReadFromOffsetExact(iVar4,&file_offset,0x38,*start_address + EVar13);
          if ((bVar2 && (int)file_offset == 1) && (local_4a8 == 0)) {
            *base_address = *start_address - local_4a0;
            break;
          }
          EVar13 = EVar13 + 0x38;
        }
      }
    }
  } while ((((pc < *start_address) || (end_address <= pc)) || (*pcVar1 != 'r')) ||
          (pcVar10[3] != 'x'));
  pcVar10 = GetHex(pcVar10 + (2 - lVar11),pcVar8,&file_offset);
  iVar4 = -1;
  iVar3 = iVar4;
  if ((pcVar10 != pcVar8) && (*pcVar10 == ' ')) {
    uVar6 = 0;
    do {
      while( true ) {
        pcVar10 = pcVar10 + 1;
        if (pcVar8 <= pcVar10) goto LAB_001173a7;
        if (*pcVar10 != ' ') break;
        uVar6 = uVar6 + 1;
      }
    } while (uVar6 < 2);
LAB_001173a7:
    if (pcVar10 != pcVar8) {
      do {
        iVar3 = open(pcVar10,0);
        if (-1 < iVar3) goto LAB_00117030;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      strncpy(out_file_name,pcVar10,(ulong)(uint)out_file_name_size);
      out_file_name[(long)out_file_name_size + -1] = '\0';
      iVar3 = iVar4;
    }
  }
LAB_00117030:
  anon_unknown_3::FileDescriptor::~FileDescriptor(&wrapped_mem_fd);
LAB_0011703a:
  anon_unknown_3::FileDescriptor::~FileDescriptor(&wrapped_maps_fd);
  return iVar3;
}

Assistant:

static ATTRIBUTE_NOINLINE int
OpenObjectFileContainingPcAndGetStartAddress(uint64_t pc,
                                             uint64_t &start_address,
                                             uint64_t &base_address,
                                             char *out_file_name,
                                             int out_file_name_size) {
  int object_fd;

  int maps_fd;
  NO_INTR(maps_fd = open("/proc/self/maps", O_RDONLY));
  FileDescriptor wrapped_maps_fd(maps_fd);
  if (wrapped_maps_fd.get() < 0) {
    return -1;
  }

  int mem_fd;
  NO_INTR(mem_fd = open("/proc/self/mem", O_RDONLY));
  FileDescriptor wrapped_mem_fd(mem_fd);
  if (wrapped_mem_fd.get() < 0) {
    return -1;
  }

  // Iterate over maps and look for the map containing the pc.  Then
  // look into the symbol tables inside.
  char buf[1024];  // Big enough for line of sane /proc/self/maps
  int num_maps = 0;
  LineReader reader(wrapped_maps_fd.get(), buf, sizeof(buf), 0);
  while (true) {
    num_maps++;
    const char *cursor;
    const char *eol;
    if (!reader.ReadLine(&cursor, &eol)) {  // EOF or malformed line.
      return -1;
    }

    // Start parsing line in /proc/self/maps.  Here is an example:
    //
    // 08048000-0804c000 r-xp 00000000 08:01 2142121    /bin/cat
    //
    // We want start address (08048000), end address (0804c000), flags
    // (r-xp) and file name (/bin/cat).

    // Read start address.
    cursor = GetHex(cursor, eol, &start_address);
    if (cursor == eol || *cursor != '-') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip '-'.

    // Read end address.
    uint64_t end_address;
    cursor = GetHex(cursor, eol, &end_address);
    if (cursor == eol || *cursor != ' ') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Read flags.  Skip flags until we encounter a space or eol.
    const char * const flags_start = cursor;
    while (cursor < eol && *cursor != ' ') {
      ++cursor;
    }
    // We expect at least four letters for flags (ex. "r-xp").
    if (cursor == eol || cursor < flags_start + 4) {
      return -1;  // Malformed line.
    }

    // Determine the base address by reading ELF headers in process memory.
    ElfW(Ehdr) ehdr;
    // Skip non-readable maps.
    if (flags_start[0] == 'r' &&
        ReadFromOffsetExact(mem_fd, &ehdr, sizeof(ElfW(Ehdr)), start_address) &&
        memcmp(ehdr.e_ident, ELFMAG, SELFMAG) == 0) {
      switch (ehdr.e_type) {
        case ET_EXEC:
          base_address = 0;
          break;
        case ET_DYN:
          // Find the segment containing file offset 0. This will correspond
          // to the ELF header that we just read. Normally this will have
          // virtual address 0, but this is not guaranteed. We must subtract
          // the virtual address from the address where the ELF header was
          // mapped to get the base address.
          //
          // If we fail to find a segment for file offset 0, use the address
          // of the ELF header as the base address.
          base_address = start_address;
          for (unsigned i = 0; i != ehdr.e_phnum; ++i) {
            ElfW(Phdr) phdr;
            if (ReadFromOffsetExact(
                    mem_fd, &phdr, sizeof(phdr),
                    start_address + ehdr.e_phoff + i * sizeof(phdr)) &&
                phdr.p_type == PT_LOAD && phdr.p_offset == 0) {
              base_address = start_address - phdr.p_vaddr;
              break;
            }
          }
          break;
        default:
          // ET_REL or ET_CORE. These aren't directly executable, so they don't
          // affect the base address.
          break;
      }
    }

    // Check start and end addresses.
    if (!(start_address <= pc && pc < end_address)) {
      continue;  // We skip this map.  PC isn't in this map.
    }

   // Check flags.  We are only interested in "r*x" maps.
    if (flags_start[0] != 'r' || flags_start[2] != 'x') {
      continue;  // We skip this map.
    }
    ++cursor;  // Skip ' '.

    // Read file offset.
    uint64_t file_offset;
    cursor = GetHex(cursor, eol, &file_offset);
    if (cursor == eol || *cursor != ' ') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Skip to file name.  "cursor" now points to dev.  We need to
    // skip at least two spaces for dev and inode.
    int num_spaces = 0;
    while (cursor < eol) {
      if (*cursor == ' ') {
        ++num_spaces;
      } else if (num_spaces >= 2) {
        // The first non-space character after skipping two spaces
        // is the beginning of the file name.
        break;
      }
      ++cursor;
    }
    if (cursor == eol) {
      return -1;  // Malformed line.
    }

    // Finally, "cursor" now points to file name of our interest.
    NO_INTR(object_fd = open(cursor, O_RDONLY));
    if (object_fd < 0) {
      // Failed to open object file.  Copy the object file name to
      // |out_file_name|.
      strncpy(out_file_name, cursor, out_file_name_size);
      // Making sure |out_file_name| is always null-terminated.
      out_file_name[out_file_name_size - 1] = '\0';
      return -1;
    }
    return object_fd;
  }
}